

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.h
# Opt level: O2

void __thiscall
spvtools::opt::SpreadVolatileSemantics::~SpreadVolatileSemantics(SpreadVolatileSemantics *this)

{
  ~SpreadVolatileSemantics(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

SpreadVolatileSemantics() {}